

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxFunctionSignature.cpp
# Opt level: O1

FunctionSignature * __thiscall
Jinx::Impl::FunctionSignature::operator=(FunctionSignature *this,FunctionSignature *copy)

{
  if (this != copy) {
    this->m_id = copy->m_id;
    this->m_visibility = copy->m_visibility;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::_M_assign
              (&this->m_libraryName,&copy->m_libraryName);
    std::
    vector<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
    ::operator=(&this->m_parts,&copy->m_parts);
  }
  return this;
}

Assistant:

inline_t FunctionSignature & FunctionSignature::operator= (const FunctionSignature & copy)
	{
		if (this != &copy)
		{
			m_id = copy.m_id;
			m_visibility = copy.m_visibility;
			m_libraryName = copy.m_libraryName;
			m_parts = copy.m_parts;
		}
		return *this;
	}